

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

void __thiscall
clickhouse::NetworkAddress::NetworkAddress(NetworkAddress *this,string *host,string *port)

{
  bool bVar1;
  int iVar2;
  char *__name;
  char *__service;
  undefined8 uVar3;
  string *in_RDI;
  int error;
  addrinfo hints;
  LocalNames *in_stack_ffffffffffffffa0;
  uint local_48 [6];
  sockaddr *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  addrinfo *in_stack_ffffffffffffffe0;
  
  *(undefined8 *)in_RDI = 0;
  memset(local_48,0,0x30);
  local_48[1] = 0;
  local_48[2] = 1;
  Singleton<clickhouse::(anonymous_namespace)::LocalNames>();
  bVar1 = anon_unknown_4::LocalNames::IsLocalName(in_stack_ffffffffffffffa0,in_RDI);
  if (!bVar1) {
    local_48[0] = local_48[0] | 0x20;
  }
  __name = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  iVar2 = getaddrinfo(__name,__service,(addrinfo *)local_48,(addrinfo **)in_RDI);
  if (iVar2 != 0) {
    uVar3 = __cxa_allocate_exception(0x20);
    __errno_location();
    std::_V2::system_category();
    std::system_error::system_error
              ((system_error *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
               (error_category *)in_stack_ffffffffffffffd0);
    __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  return;
}

Assistant:

NetworkAddress::NetworkAddress(const std::string& host, const std::string& port)
    : info_(nullptr)
{
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));

    hints.ai_family = PF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    if (!Singleton<LocalNames>()->IsLocalName(host)) {
        // https://linux.die.net/man/3/getaddrinfo
        // If hints.ai_flags includes the AI_ADDRCONFIG flag,
        // then IPv4 addresses are returned in the list pointed to by res only
        // if the local system has at least one IPv4 address configured,
        // and IPv6 addresses are only returned if the local system
        // has at least one IPv6 address configured.
        // The loopback address is not considered for this case
        // as valid as a configured address.
        hints.ai_flags |= AI_ADDRCONFIG;
    }

    const int error = getaddrinfo(host.c_str(), port.c_str(), &hints, &info_);

    if (error) {
        throw std::system_error(errno, std::system_category());
    }
}